

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cc
# Opt level: O1

optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
* __thiscall
hmi::window::poll_event
          (optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
           *__return_storage_ptr__,window *this)

{
  Uint32 window_id;
  int iVar1;
  SDL_Event event;
  SDL_Event local_50;
  
  window_id = SDL_GetWindowID(this->m_window);
  do {
    iVar1 = SDL_PollEvent(&local_50);
    if (iVar1 == 0) {
      (__return_storage_ptr__->
      super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
      )._M_payload.
      super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
      ._M_engaged = false;
      return __return_storage_ptr__;
    }
    anon_unknown_0::translate_event(__return_storage_ptr__,window_id,&local_50);
  } while ((__return_storage_ptr__->
           super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
           )._M_payload.
           super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
           ._M_engaged != true);
  return __return_storage_ptr__;
}

Assistant:

std::optional<window_event> window::poll_event() {
    Uint32 window_id = SDL_GetWindowID(m_window);

    for (;;) {
      SDL_Event event;
      int status = SDL_PollEvent(&event);

      if (status == 0) {
        return std::nullopt;
      }

      std::optional<window_event> event_maybe = translate_event(window_id, event);

      if (event_maybe) {
        return event_maybe;
      }
    }
  }